

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbformat.cc
# Opt level: O0

string * __thiscall
leveldb::InternalKey::DebugString_abi_cxx11_(string *__return_storage_ptr__,InternalKey *this)

{
  bool bVar1;
  ostream *poVar2;
  Slice *value;
  Slice local_1f0;
  string local_1e0;
  ostringstream local_1c0 [8];
  ostringstream ss;
  Slice local_48;
  undefined1 local_38 [8];
  ParsedInternalKey parsed;
  InternalKey *this_local;
  
  parsed._24_8_ = this;
  ParsedInternalKey::ParsedInternalKey((ParsedInternalKey *)local_38);
  Slice::Slice(&local_48,&this->rep_);
  bVar1 = ParseInternalKey(&local_48,(ParsedInternalKey *)local_38);
  if (bVar1) {
    ParsedInternalKey::DebugString_abi_cxx11_(__return_storage_ptr__,(ParsedInternalKey *)local_38);
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_1c0);
    poVar2 = std::operator<<((ostream *)local_1c0,"(bad)");
    Slice::Slice(&local_1f0,&this->rep_);
    EscapeString_abi_cxx11_(&local_1e0,(leveldb *)&local_1f0,value);
    std::operator<<(poVar2,(string *)&local_1e0);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::__cxx11::ostringstream::str();
    std::__cxx11::ostringstream::~ostringstream(local_1c0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string InternalKey::DebugString() const {
  ParsedInternalKey parsed;
  if (ParseInternalKey(rep_, &parsed)) {
    return parsed.DebugString();
  }
  std::ostringstream ss;
  ss << "(bad)" << EscapeString(rep_);
  return ss.str();
}